

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O1

void __thiscall cppcms::http::context::on_request_ready(context *this,bool error)

{
  _data *p_Var1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  application *this_01;
  undefined7 in_register_00000031;
  intrusive_ptr<cppcms::application> app;
  context_guard g;
  intrusive_ptr<cppcms::application> local_80;
  shared_ptr<cppcms::application_specific_pool> local_78;
  shared_ptr<cppcms::http::context> local_68;
  context_guard local_58 [7];
  
  p_Var1 = (this->d).ptr_;
  peVar2 = (p_Var1->pool).
           super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (p_Var1->pool).
            super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (p_Var1->pool).super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (p_Var1->pool).super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->d).ptr_;
  this_01 = (p_Var1->app).p_;
  (p_Var1->app).p_ = (application *)0x0;
  local_80.p_ = this_01;
  if ((int)CONCAT71(in_register_00000031,error) == 0) {
    if (this_01 == (application *)0x0) {
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      local_78.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar2;
      local_78.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = this_00;
      submit_to_pool_internal(this,&local_78,&((this->d).ptr_)->matched,true);
      if (local_78.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.
                   super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
    }
    else {
      std::__shared_ptr<cppcms::http::context,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<cppcms::http::context,void>
                ((__shared_ptr<cppcms::http::context,(__gnu_cxx::_Lock_policy)2> *)&local_68,
                 (__weak_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2> *)this);
      application::assign_context(this_01,&local_68);
      if (local_68.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      dispatch(&local_80,&((this->d).ptr_)->matched,false);
    }
  }
  else if (this_01 != (application *)0x0) {
    local_58[0].app_ = this_01;
    application::add_context(this_01,this);
    http::request::on_error(&((this->d).ptr_)->request);
    anon_unknown_3::context_guard::~context_guard(local_58);
  }
  booster::intrusive_ptr<cppcms::application>::~intrusive_ptr(&local_80);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void context::on_request_ready(bool error)
{
	booster::shared_ptr<application_specific_pool> pool;
	booster::intrusive_ptr<application> app;
	pool.swap(d->pool);
	app.swap(d->app);

	if(error) {
		if(app) {
			try {
				context_guard g(app.get(),*this);
				request().on_error();
			}
			catch(std::exception const &e) {
				BOOSTER_ERROR("cppcms") << "exception at request::on_error" << e.what() << booster::trace(e);
			}
			catch(...) {
				BOOSTER_ERROR("cppcms") << "Unknown exception at request::on_error";
			}
		}
		return;
	}

	if(app) {
		app->assign_context(self());
		dispatch(app,d->matched,false);
		return;
	}

	submit_to_pool_internal(pool,d->matched,true);
}